

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,unsigned_long value)

{
  ostream *poVar1;
  ostringstream oss;
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  if ((Catch *)0xff < this) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," (0x",4);
    *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
         *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( unsigned long value ) {
    std::ostringstream oss;
    oss << value;
    if( value > Detail::hexThreshold )
        oss << " (0x" << std::hex << value << ")";
    return oss.str();
}